

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

shared_ptr<SchemePort>
get_output_port(list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *l,string *proc,size_t skip)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  eval_error *this;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SchemePort> sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _List_node_base *local_50;
  _List_const_iterator<std::shared_ptr<SchemeObject>_> local_48;
  shared_ptr<SchemeObject> local_40;
  undefined1 local_29;
  ulong local_28;
  size_t skip_local;
  string *proc_local;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l_local;
  shared_ptr<SchemePort> *port;
  
  local_29 = 0;
  local_28 = in_RCX;
  skip_local = skip;
  proc_local = proc;
  l_local = l;
  std::shared_ptr<SchemePort>::shared_ptr((shared_ptr<SchemePort> *)l,&current_output_port);
  sVar2 = std::__cxx11::
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::size
                    ((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                      *)proc_local);
  if (local_28 < sVar2) {
    local_50 = (_List_node_base *)
               std::__cxx11::
               list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               ::begin((list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                        *)proc_local);
    local_48 = std::next<std::_List_const_iterator<std::shared_ptr<SchemeObject>>>
                         ((_List_const_iterator<std::shared_ptr<SchemeObject>_>)local_50,local_28);
    std::_List_const_iterator<std::shared_ptr<SchemeObject>_>::operator*(&local_48);
    std::dynamic_pointer_cast<SchemePort,SchemeObject>(&local_40);
    std::shared_ptr<SchemePort>::operator=
              ((shared_ptr<SchemePort> *)l,(shared_ptr<SchemePort> *)&local_40);
    std::shared_ptr<SchemePort>::~shared_ptr((shared_ptr<SchemePort> *)&local_40);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)l);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<SchemePort,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemePort,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )l);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->output_stream);
    if (bVar1) {
      sVar4.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar4.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)l;
      return (shared_ptr<SchemePort>)
             sVar4.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this = (eval_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)skip_local,
                 ": bad port");
  eval_error::runtime_error(this,&local_80);
  __cxa_throw(this,&eval_error::typeinfo,eval_error::~eval_error);
}

Assistant:

static std::shared_ptr<SchemePort>
get_output_port(const std::list<std::shared_ptr<SchemeObject>> &l, const std::string &proc, size_t skip)
{
    auto port = current_output_port;
    if(l.size() > skip)
        port = std::dynamic_pointer_cast<SchemePort>(*next(l.begin(), skip));
    if(!port || !port->output_stream)
        throw eval_error(proc + ": bad port");
    return port;
}